

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmUmdTranslationTable.cpp
# Opt level: O1

GMM_STATUS __thiscall GmmLib::PageTable::DestroyL3Table(PageTable *this)

{
  HANDLE pvVar1;
  GMM_CLIENT ClientType;
  GMM_STATUS GVar2;
  undefined1 auStack_48 [8];
  GMM_DEVICE_DEALLOC Dealloc;
  
  Dealloc.GfxVA = 0;
  Dealloc.Priv = (void *)0x0;
  auStack_48 = (undefined1  [8])0x0;
  Dealloc.Handle = (HANDLE)0x0;
  if (this->pClientContext == (GmmClientContext *)0x0) {
    ClientType = GMM_UNDEFINED_CLIENT;
  }
  else {
    ClientType = (*this->pClientContext->_vptr_GmmClientContext[2])();
  }
  pthread_mutex_lock((pthread_mutex_t *)&this->TTLock);
  pvVar1 = (this->TTL3).L3Handle;
  if (pvVar1 == (HANDLE)0x0) {
    GVar2 = GMM_SUCCESS;
  }
  else {
    Dealloc.Handle = (HANDLE)(this->TTL3).GfxAddress;
    Dealloc.GfxVA = (GMM_GFX_ADDRESS)(this->TTL3).pGmmResInfo;
    Dealloc.Priv = this->PageTableMgr->hCsr;
    auStack_48 = (undefined1  [8])pvVar1;
    GVar2 = __GmmDeviceDealloc(ClientType,&this->PageTableMgr->DeviceCbInt,
                               (GMM_DEVICE_DEALLOC *)auStack_48,this->pClientContext);
    (this->TTL3).L3Handle = (HANDLE)0x0;
    (this->TTL3).GfxAddress = 0;
    (this->TTL3).CPUAddress = 0;
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->TTLock);
  return GVar2;
}

Assistant:

GMM_STATUS GmmLib::PageTable::DestroyL3Table()
{
    GMM_STATUS         Status = GMM_SUCCESS;
    uint8_t            hr     = GMM_SUCCESS;
    GMM_CLIENT         ClientType;
    GMM_DEVICE_DEALLOC Dealloc = {0};

    GET_GMM_CLIENT_TYPE(pClientContext, ClientType);

    EnterCriticalSection(&TTLock);

    if(TTL3.L3Handle)
    {
        Dealloc.Handle = TTL3.L3Handle;
        Dealloc.GfxVA  = TTL3.GfxAddress;
        Dealloc.Priv   = TTL3.pGmmResInfo;
        Dealloc.hCsr   = PageTableMgr->hCsr;

        Status = __GmmDeviceDealloc(ClientType, &PageTableMgr->DeviceCbInt, &Dealloc, pClientContext);

        TTL3.L3Handle   = NULL;
        TTL3.GfxAddress = 0;
        TTL3.CPUAddress = 0;
    }

    LeaveCriticalSection(&TTLock);
    return Status;
}